

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_compress.c
# Opt level: O1

int get_file_format(char *filename)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = strrchr(filename,0x2e);
  if (pcVar2 != (char *)0x0) {
    lVar3 = 0;
    do {
      iVar1 = strcasecmp(pcVar2 + 1,
                         (char *)((long)&get_file_format_extension_rel +
                                 (long)*(int *)((long)&get_file_format_extension_rel + lVar3)));
      if (iVar1 == 0) {
        return *(int *)((long)get_file_format::format + lVar3);
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x40);
  }
  return -1;
}

Assistant:

static int get_file_format(char *filename)
{
    unsigned int i;
    static const char *extension[] = {
        "pgx", "pnm", "pgm", "ppm", "pbm", "pam", "bmp", "tif", "raw", "rawl", "tga", "png", "j2k", "jp2", "j2c", "jpc"
    };
    static const int format[] = {
        PGX_DFMT, PXM_DFMT, PXM_DFMT, PXM_DFMT, PXM_DFMT, PXM_DFMT, BMP_DFMT, TIF_DFMT, RAW_DFMT, RAWL_DFMT, TGA_DFMT, PNG_DFMT, J2K_CFMT, JP2_CFMT, J2K_CFMT, J2K_CFMT
    };
    char * ext = strrchr(filename, '.');
    if (ext == NULL) {
        return -1;
    }
    ext++;
    for (i = 0; i < sizeof(format) / sizeof(*format); i++) {
        if (strcasecmp(ext, extension[i]) == 0) {
            return format[i];
        }
    }
    return -1;
}